

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::Optimize(BackwardPass *this)

{
  undefined1 *puVar1;
  Type *ppDVar2;
  Type *pppBVar3;
  BVSparseNode **this_00;
  Phase phase;
  AllocatorType *allocator;
  BVSparseNode<Memory::JitArenaAllocator> *pBVar4;
  DictionaryStats *pDVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  JITTimeFunctionBody *pJVar9;
  FunctionJITTimeInfo *pFVar10;
  Type pDVar11;
  BVSparseNode *pBVar12;
  BVSparseNode<Memory::JitArenaAllocator> *pBVar13;
  char16_t *pcVar14;
  Type pDVar15;
  BVSparseNode *pBVar16;
  Type pBVar17;
  BasicBlock *block;
  undefined1 local_230 [8];
  NoRecoverMemoryJitArenaAllocator localAlloc;
  FloatSymEquivalenceMap localFloatSymEquivalenceMap;
  NumberTempRepresentativePropertySymMap localNumberTempRepresentativePropertySym;
  BVSparse<Memory::JitArenaAllocator> localCandidateSymsRequiredToBeLossyInt;
  BVSparse<Memory::JitArenaAllocator> localConsiderSymsAsRealUsesInNoImplicitCallUses;
  BVSparse<Memory::JitArenaAllocator> localNegativeZeroDoesNotMatterBySymId;
  BVSparse<Memory::JitArenaAllocator> localSymUsedOnlyForBitOpsBySymId;
  BVSparse<Memory::JitArenaAllocator> localSymUsedOnlyForNumberBySymId;
  BVSparse<Memory::JitArenaAllocator> localIntOverflowDoesNotMatterBySymId;
  BVSparse<Memory::JitArenaAllocator> localIntOverflowDoesNotMatterInRangeBySymId;
  BVSparse<Memory::JitArenaAllocator> localCandidateSymsRequiredToBeInt;
  
  if (this->tag == BackwardPhase) {
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,BackwardPhase,uVar7,uVar8);
    if (bVar6) {
      return;
    }
  }
  if (this->tag == CaptureByteCodeRegUsePhase) {
    bVar6 = Js::PhaseIsEnabled::CaptureByteCodeRegUsePhase<Func*>(this->func);
    if (!bVar6) {
      return;
    }
    bVar6 = DoCaptureByteCodeUpwardExposedUsed(this);
    if (!bVar6) {
      return;
    }
  }
  if (this->tag == DeadStorePhase) {
    bVar6 = Func::DoLoopFastPaths(this->func);
    if ((!bVar6) || (bVar6 = Func::DoFastPaths(this->func), !bVar6)) {
      puVar1 = &this->func->field_0x240;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffffffbf;
    }
    InsertArgInsForFormals(this);
  }
  pcVar14 = L"BE-DeadStore";
  if (this->tag == BackwardPhase) {
    pcVar14 = L"BE-Backward";
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_230,pcVar14
             ,(this->func->m_alloc->super_ArenaAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              super_ArenaData.pageAllocator,Js::Throw::OutOfMemory,(_func_void *)0x0);
  localAlloc.super_JitArenaAllocator.super_ArenaAllocator.
  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList = (void *)0x0;
  this->tempAlloc = (JitArenaAllocator *)local_230;
  bVar6 = IsTraceEnabled(this);
  if (bVar6) {
    Func::DumpHeader(this->func);
  }
  CleanupBackwardPassInfoInFlowGraph(this);
  allocator = this->tempAlloc;
  localNegativeZeroDoesNotMatterBySymId.alloc =
       (Type)&localConsiderSymsAsRealUsesInNoImplicitCallUses.lastUsedNodePrevNextField;
  localConsiderSymsAsRealUsesInNoImplicitCallUses.lastUsedNodePrevNextField = (Type)0x0;
  localNegativeZeroDoesNotMatterBySymId.head = (Type_conflict)0x0;
  this->negativeZeroDoesNotMatterBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)localNegativeZeroDoesNotMatterBySymId.alloc;
  localSymUsedOnlyForBitOpsBySymId.alloc =
       (Type)&localNegativeZeroDoesNotMatterBySymId.lastUsedNodePrevNextField;
  localNegativeZeroDoesNotMatterBySymId.lastUsedNodePrevNextField = (Type)0x0;
  localSymUsedOnlyForBitOpsBySymId.head = (Type_conflict)0x0;
  this->symUsedOnlyForBitOpsBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)localSymUsedOnlyForBitOpsBySymId.alloc;
  localSymUsedOnlyForNumberBySymId.alloc =
       (Type)&localSymUsedOnlyForBitOpsBySymId.lastUsedNodePrevNextField;
  localSymUsedOnlyForBitOpsBySymId.lastUsedNodePrevNextField = (Type)0x0;
  localSymUsedOnlyForNumberBySymId.head = (Type_conflict)0x0;
  this->symUsedOnlyForNumberBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)localSymUsedOnlyForNumberBySymId.alloc;
  localIntOverflowDoesNotMatterBySymId.alloc =
       (Type)&localSymUsedOnlyForNumberBySymId.lastUsedNodePrevNextField;
  localSymUsedOnlyForNumberBySymId.lastUsedNodePrevNextField = (Type)0x0;
  localIntOverflowDoesNotMatterBySymId.head = (Type_conflict)0x0;
  this->intOverflowDoesNotMatterBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)localIntOverflowDoesNotMatterBySymId.alloc;
  localIntOverflowDoesNotMatterInRangeBySymId.alloc =
       (Type)&localIntOverflowDoesNotMatterBySymId.lastUsedNodePrevNextField;
  localIntOverflowDoesNotMatterBySymId.lastUsedNodePrevNextField = (Type)0x0;
  localIntOverflowDoesNotMatterInRangeBySymId.head = (Type_conflict)0x0;
  this->intOverflowDoesNotMatterInRangeBySymId =
       (BVSparse<Memory::JitArenaAllocator> *)localIntOverflowDoesNotMatterInRangeBySymId.alloc;
  localIntOverflowDoesNotMatterInRangeBySymId.lastUsedNodePrevNextField = (Type)0x0;
  this->candidateSymsRequiredToBeInt =
       (BVSparse<Memory::JitArenaAllocator> *)
       &localIntOverflowDoesNotMatterInRangeBySymId.lastUsedNodePrevNextField;
  ppDVar2 = &localNumberTempRepresentativePropertySym.stats;
  localNumberTempRepresentativePropertySym.stats = (Type)0x0;
  localCandidateSymsRequiredToBeLossyInt.head = (Type_conflict)0x0;
  this->candidateSymsRequiredToBeLossyInt = (BVSparse<Memory::JitArenaAllocator> *)ppDVar2;
  pppBVar3 = &localCandidateSymsRequiredToBeLossyInt.lastUsedNodePrevNextField;
  localCandidateSymsRequiredToBeLossyInt.lastUsedNodePrevNextField = (Type)0x0;
  localConsiderSymsAsRealUsesInNoImplicitCallUses.head = (Type_conflict)0x0;
  this->considerSymsAsRealUsesInNoImplicitCallUses = (BVSparse<Memory::JitArenaAllocator> *)pppBVar3
  ;
  this->intOverflowCurrentlyMattersInRange = true;
  this_00 = &localAlloc.super_JitArenaAllocator.bvFreeList;
  localCandidateSymsRequiredToBeLossyInt.lastFoundIndex = (Type_conflict)allocator;
  localCandidateSymsRequiredToBeLossyInt.alloc = (Type)ppDVar2;
  localConsiderSymsAsRealUsesInNoImplicitCallUses.lastFoundIndex = (Type_conflict)allocator;
  localConsiderSymsAsRealUsesInNoImplicitCallUses.alloc = (Type)pppBVar3;
  localNegativeZeroDoesNotMatterBySymId.lastFoundIndex = (Type_conflict)allocator;
  localSymUsedOnlyForBitOpsBySymId.lastFoundIndex = (Type_conflict)allocator;
  localSymUsedOnlyForNumberBySymId.lastFoundIndex = (Type_conflict)allocator;
  localIntOverflowDoesNotMatterBySymId.lastFoundIndex = (Type_conflict)allocator;
  localIntOverflowDoesNotMatterInRangeBySymId.lastFoundIndex = (Type_conflict)allocator;
  JsUtil::
  BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)this_00,allocator,0);
  this->floatSymEquivalenceMap = (FloatSymEquivalenceMap *)this_00;
  JsUtil::
  BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localFloatSymEquivalenceMap.stats,this->tempAlloc,0);
  this->numberTempRepresentativePropertySym =
       (NumberTempRepresentativePropertySymMap *)&localFloatSymEquivalenceMap.stats;
  for (block = this->func->m_fg->tailBlock; block != (BasicBlock *)0x0; block = block->prev) {
    if ((*(ushort *)&block->field_0x18 & 3) != 1) {
      OptBlock(this,block);
    }
  }
  if (this->tag == DeadStorePhase) {
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,MemOpPhase,uVar7,uVar8);
    if (!bVar6) {
      RemoveEmptyLoops(this);
    }
  }
  this->func->m_fg->hasBackwardPassInfo = true;
  bVar6 = DoTrackCompoundedIntOverflow(this);
  if (bVar6) {
    SymTable::ClearStackSymScratch(this->func->m_symTable);
  }
  phase = this->tag;
  pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
  pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015ca868,phase,uVar7,uVar8);
  if (bVar6) {
    Func::DumpHeader(this->func);
    pcVar14 = L"Deadstore Phase Stats:\n";
    if (this->tag == BackwardPhase) {
      pcVar14 = L"Backward Phase Stats:\n";
    }
    Output::Print(pcVar14);
    if ((this->tag == DeadStorePhase) && (bVar6 = DoDeadStore(this->func), bVar6)) {
      Output::Print(L"  Deadstore              : %3d\n",(ulong)this->numDeadStore);
    }
    if ((this->tag == BackwardPhase) && (bVar6 = SatisfyMarkTempObjectsConditions(this), bVar6)) {
      Output::Print(L"  Temp Object            : %3d\n",(ulong)this->numMarkTempObject);
    }
  }
  JsUtil::
  BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localFloatSymEquivalenceMap.stats);
  JsUtil::
  BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localAlloc.super_JitArenaAllocator.bvFreeList);
  if (localCandidateSymsRequiredToBeLossyInt.lastUsedNodePrevNextField != (Type)0x0) {
    pBVar4 = (BVSparseNode<Memory::JitArenaAllocator> *)
             localCandidateSymsRequiredToBeLossyInt.lastUsedNodePrevNextField;
    pBVar17 = *(Type *)&localConsiderSymsAsRealUsesInNoImplicitCallUses.lastFoundIndex[5].startIndex
    ;
    do {
      pBVar13 = pBVar4;
      pBVar4 = pBVar13->next;
      pBVar13->next = pBVar17;
      pBVar17 = pBVar13;
    } while (pBVar4 != (BVSparseNode<Memory::JitArenaAllocator> *)0x0);
    localConsiderSymsAsRealUsesInNoImplicitCallUses.head = (Type_conflict)0x0;
    *(BVSparseNode<Memory::JitArenaAllocator> **)
     &localConsiderSymsAsRealUsesInNoImplicitCallUses.lastFoundIndex[5].startIndex = pBVar13;
    localConsiderSymsAsRealUsesInNoImplicitCallUses.alloc = (Type)pppBVar3;
  }
  if (localNumberTempRepresentativePropertySym.stats != (Type)0x0) {
    pDVar5 = localNumberTempRepresentativePropertySym.stats;
    pDVar15 = *(Type *)&localCandidateSymsRequiredToBeLossyInt.lastFoundIndex[5].startIndex;
    do {
      pDVar11 = pDVar5;
      pDVar5 = pDVar11->pNext;
      pDVar11->pNext = pDVar15;
      pDVar15 = pDVar11;
    } while (pDVar5 != (DictionaryStats *)0x0);
    localCandidateSymsRequiredToBeLossyInt.head = (Type_conflict)0x0;
    *(Type *)&localCandidateSymsRequiredToBeLossyInt.lastFoundIndex[5].startIndex = pDVar11;
    localCandidateSymsRequiredToBeLossyInt.alloc = (Type)ppDVar2;
  }
  if (localIntOverflowDoesNotMatterInRangeBySymId.lastUsedNodePrevNextField != (Type)0x0) {
    pBVar17 = (Type)localIntOverflowDoesNotMatterInRangeBySymId.lastUsedNodePrevNextField;
    pBVar16 = allocator->bvFreeList;
    do {
      pBVar12 = pBVar17;
      pBVar17 = pBVar12->next;
      pBVar12->next = pBVar16;
      pBVar16 = pBVar12;
    } while (pBVar17 != (Type)0x0);
    allocator->bvFreeList = pBVar12;
  }
  if (localIntOverflowDoesNotMatterBySymId.lastUsedNodePrevNextField != (Type)0x0) {
    pBVar4 = (BVSparseNode<Memory::JitArenaAllocator> *)
             localIntOverflowDoesNotMatterBySymId.lastUsedNodePrevNextField;
    pBVar17 = *(Type *)&localIntOverflowDoesNotMatterInRangeBySymId.lastFoundIndex[5].startIndex;
    do {
      pBVar13 = pBVar4;
      pBVar4 = pBVar13->next;
      pBVar13->next = pBVar17;
      pBVar17 = pBVar13;
    } while (pBVar4 != (BVSparseNode<Memory::JitArenaAllocator> *)0x0);
    localIntOverflowDoesNotMatterInRangeBySymId.head = (Type_conflict)0x0;
    *(BVSparseNode<Memory::JitArenaAllocator> **)
     &localIntOverflowDoesNotMatterInRangeBySymId.lastFoundIndex[5].startIndex = pBVar13;
    localIntOverflowDoesNotMatterInRangeBySymId.alloc =
         (Type)&localIntOverflowDoesNotMatterBySymId.lastUsedNodePrevNextField;
  }
  if (localSymUsedOnlyForNumberBySymId.lastUsedNodePrevNextField != (Type)0x0) {
    pBVar4 = (BVSparseNode<Memory::JitArenaAllocator> *)
             localSymUsedOnlyForNumberBySymId.lastUsedNodePrevNextField;
    pBVar17 = *(Type *)&localIntOverflowDoesNotMatterBySymId.lastFoundIndex[5].startIndex;
    do {
      pBVar13 = pBVar4;
      pBVar4 = pBVar13->next;
      pBVar13->next = pBVar17;
      pBVar17 = pBVar13;
    } while (pBVar4 != (BVSparseNode<Memory::JitArenaAllocator> *)0x0);
    localIntOverflowDoesNotMatterBySymId.head = (Type_conflict)0x0;
    *(BVSparseNode<Memory::JitArenaAllocator> **)
     &localIntOverflowDoesNotMatterBySymId.lastFoundIndex[5].startIndex = pBVar13;
    localIntOverflowDoesNotMatterBySymId.alloc =
         (Type)&localSymUsedOnlyForNumberBySymId.lastUsedNodePrevNextField;
  }
  if (localSymUsedOnlyForBitOpsBySymId.lastUsedNodePrevNextField != (Type)0x0) {
    pBVar4 = (BVSparseNode<Memory::JitArenaAllocator> *)
             localSymUsedOnlyForBitOpsBySymId.lastUsedNodePrevNextField;
    pBVar17 = *(Type *)&localSymUsedOnlyForNumberBySymId.lastFoundIndex[5].startIndex;
    do {
      pBVar13 = pBVar4;
      pBVar4 = pBVar13->next;
      pBVar13->next = pBVar17;
      pBVar17 = pBVar13;
    } while (pBVar4 != (BVSparseNode<Memory::JitArenaAllocator> *)0x0);
    localSymUsedOnlyForNumberBySymId.head = (Type_conflict)0x0;
    *(BVSparseNode<Memory::JitArenaAllocator> **)
     &localSymUsedOnlyForNumberBySymId.lastFoundIndex[5].startIndex = pBVar13;
    localSymUsedOnlyForNumberBySymId.alloc =
         (Type)&localSymUsedOnlyForBitOpsBySymId.lastUsedNodePrevNextField;
  }
  if (localNegativeZeroDoesNotMatterBySymId.lastUsedNodePrevNextField != (Type)0x0) {
    pBVar4 = (BVSparseNode<Memory::JitArenaAllocator> *)
             localNegativeZeroDoesNotMatterBySymId.lastUsedNodePrevNextField;
    pBVar17 = *(Type *)&localSymUsedOnlyForBitOpsBySymId.lastFoundIndex[5].startIndex;
    do {
      pBVar13 = pBVar4;
      pBVar4 = pBVar13->next;
      pBVar13->next = pBVar17;
      pBVar17 = pBVar13;
    } while (pBVar4 != (BVSparseNode<Memory::JitArenaAllocator> *)0x0);
    localSymUsedOnlyForBitOpsBySymId.head = (Type_conflict)0x0;
    *(BVSparseNode<Memory::JitArenaAllocator> **)
     &localSymUsedOnlyForBitOpsBySymId.lastFoundIndex[5].startIndex = pBVar13;
    localSymUsedOnlyForBitOpsBySymId.alloc =
         (Type)&localNegativeZeroDoesNotMatterBySymId.lastUsedNodePrevNextField;
  }
  if (localConsiderSymsAsRealUsesInNoImplicitCallUses.lastUsedNodePrevNextField != (Type)0x0) {
    pBVar4 = (BVSparseNode<Memory::JitArenaAllocator> *)
             localConsiderSymsAsRealUsesInNoImplicitCallUses.lastUsedNodePrevNextField;
    pBVar17 = *(Type *)&localNegativeZeroDoesNotMatterBySymId.lastFoundIndex[5].startIndex;
    do {
      pBVar13 = pBVar4;
      pBVar4 = pBVar13->next;
      pBVar13->next = pBVar17;
      pBVar17 = pBVar13;
    } while (pBVar4 != (BVSparseNode<Memory::JitArenaAllocator> *)0x0);
    localNegativeZeroDoesNotMatterBySymId.head = (Type_conflict)0x0;
    *(BVSparseNode<Memory::JitArenaAllocator> **)
     &localNegativeZeroDoesNotMatterBySymId.lastFoundIndex[5].startIndex = pBVar13;
    localNegativeZeroDoesNotMatterBySymId.alloc =
         (Type)&localConsiderSymsAsRealUsesInNoImplicitCallUses.lastUsedNodePrevNextField;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_230);
  return;
}

Assistant:

void
BackwardPass::Optimize()
{
    if (tag == Js::BackwardPhase && PHASE_OFF(tag, this->func))
    {
        return;
    }

    if (tag == Js::CaptureByteCodeRegUsePhase && (!PHASE_ENABLED(CaptureByteCodeRegUsePhase, this->func) || !DoCaptureByteCodeUpwardExposedUsed()))
    {
        return;
    }

    if (tag == Js::DeadStorePhase)
    {
        if (!this->func->DoLoopFastPaths() || !this->func->DoFastPaths())
        {
            //arguments[] access is similar to array fast path hence disable when array fastpath is disabled.
            //loopFastPath is always true except explicitly disabled
            //defaultDoFastPath can be false when we the source code size is huge
            func->SetHasStackArgs(false);
        }
        InsertArgInsForFormals();
    }

    NoRecoverMemoryJitArenaAllocator localAlloc(tag == Js::BackwardPhase? _u("BE-Backward") : _u("BE-DeadStore"),
        this->func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);

    this->tempAlloc = &localAlloc;
#if DBG_DUMP
    if (this->IsTraceEnabled())
    {
        this->func->DumpHeader();
    }
#endif

    this->CleanupBackwardPassInfoInFlowGraph();

    // Info about whether a sym is used in a way in which -0 differs from +0, or whether the sym is used in a way in which an
    // int32 overflow when generating the value of the sym matters, in the current block. The info is transferred to
    // instructions that define the sym in the current block as they are encountered. The info in these bit vectors is discarded
    // after optimizing each block, so the only info that remains for GlobOpt is that which is transferred to instructions.
    BVSparse<JitArenaAllocator> localNegativeZeroDoesNotMatterBySymId(tempAlloc);
    negativeZeroDoesNotMatterBySymId = &localNegativeZeroDoesNotMatterBySymId;

    BVSparse<JitArenaAllocator> localSymUsedOnlyForBitOpsBySymId(tempAlloc);
    symUsedOnlyForBitOpsBySymId = &localSymUsedOnlyForBitOpsBySymId;
    BVSparse<JitArenaAllocator> localSymUsedOnlyForNumberBySymId(tempAlloc);
    symUsedOnlyForNumberBySymId = &localSymUsedOnlyForNumberBySymId;

    BVSparse<JitArenaAllocator> localIntOverflowDoesNotMatterBySymId(tempAlloc);
    intOverflowDoesNotMatterBySymId = &localIntOverflowDoesNotMatterBySymId;
    BVSparse<JitArenaAllocator> localIntOverflowDoesNotMatterInRangeBySymId(tempAlloc);
    intOverflowDoesNotMatterInRangeBySymId = &localIntOverflowDoesNotMatterInRangeBySymId;
    BVSparse<JitArenaAllocator> localCandidateSymsRequiredToBeInt(tempAlloc);
    candidateSymsRequiredToBeInt = &localCandidateSymsRequiredToBeInt;
    BVSparse<JitArenaAllocator> localCandidateSymsRequiredToBeLossyInt(tempAlloc);
    candidateSymsRequiredToBeLossyInt = &localCandidateSymsRequiredToBeLossyInt;
    BVSparse<JitArenaAllocator> localConsiderSymsAsRealUsesInNoImplicitCallUses(tempAlloc);
    considerSymsAsRealUsesInNoImplicitCallUses = &localConsiderSymsAsRealUsesInNoImplicitCallUses;
    intOverflowCurrentlyMattersInRange = true;

    FloatSymEquivalenceMap localFloatSymEquivalenceMap(tempAlloc);
    floatSymEquivalenceMap = &localFloatSymEquivalenceMap;

    NumberTempRepresentativePropertySymMap localNumberTempRepresentativePropertySym(tempAlloc);
    numberTempRepresentativePropertySym = &localNumberTempRepresentativePropertySym;

    FOREACH_BLOCK_BACKWARD_IN_FUNC_DEAD_OR_ALIVE(block, this->func)
    {
        this->OptBlock(block);
    }
    NEXT_BLOCK_BACKWARD_IN_FUNC_DEAD_OR_ALIVE;

    if (this->tag == Js::DeadStorePhase && !PHASE_OFF(Js::MemOpPhase, this->func))
    {
        this->RemoveEmptyLoops();
    }
    this->func->m_fg->hasBackwardPassInfo = true;

    if(DoTrackCompoundedIntOverflow())
    {
        // Tracking int overflow makes use of a scratch field in stack syms, which needs to be cleared
        func->m_symTable->ClearStackSymScratch();
    }

#if DBG_DUMP
    if (PHASE_STATS(this->tag, this->func))
    {
        this->func->DumpHeader();
        Output::Print(this->tag == Js::BackwardPhase? _u("Backward Phase Stats:\n") : _u("Deadstore Phase Stats:\n"));
        if (this->DoDeadStore())
        {
            Output::Print(_u("  Deadstore              : %3d\n"), this->numDeadStore);
        }
        if (this->DoMarkTempNumbers())
        {
            Output::Print(_u("  Temp Number            : %3d\n"), this->numMarkTempNumber);
            Output::Print(_u("  Transferred Temp Number: %3d\n"), this->numMarkTempNumberTransferred);
        }
        if (this->DoMarkTempObjects())
        {
            Output::Print(_u("  Temp Object            : %3d\n"), this->numMarkTempObject);
        }
    }
#endif
}